

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.cpp
# Opt level: O2

void __thiscall
oout::MatchTest::MatchTest
          (MatchTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MatchTest_00129630;
  std::__shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->text).super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>,
             &text->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->match).super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>,
             &match->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

MatchTest::MatchTest(
	const shared_ptr<const Text> &text,
	const shared_ptr<const Match> &match
) : text(text), match(match)
{
}